

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string_view classname,
          NameEquality equality_mode)

{
  int iVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  NameEquality NVar5;
  EnumDescriptor *pEVar6;
  ServiceDescriptor *pSVar7;
  Descriptor *this_00;
  int i;
  int iVar8;
  NameEquality equality_mode_00;
  int i_2;
  string_view a;
  string_view a_00;
  string_view classname_00;
  
  iVar8 = 0;
  equality_mode_00 = equality_mode;
  while (iVar8 < file->enum_type_count_) {
    pEVar6 = FileDescriptor::enum_type(file,iVar8);
    puVar2 = (ushort *)(pEVar6->all_names_).payload_;
    a._M_len = (ulong)*puVar2;
    a._M_str = (char *)((long)puVar2 + ~a._M_len);
    NVar5 = java::anon_unknown_0::CheckNameEquality(a,classname);
    iVar8 = iVar8 + 1;
    if (NVar5 == equality_mode) {
      return true;
    }
  }
  iVar8 = 0;
  do {
    if (file->service_count_ <= iVar8) {
      iVar8 = 0;
      do {
        iVar1 = file->message_type_count_;
        bVar3 = iVar8 < iVar1;
        if (iVar1 <= iVar8) {
          return bVar3;
        }
        this_00 = FileDescriptor::message_type(file,iVar8);
        classname_00._M_str._0_4_ = equality_mode;
        classname_00._M_len = (size_t)classname._M_str;
        classname_00._M_str._4_4_ = 0;
        bVar4 = java::anon_unknown_0::MessageHasConflictingClassName
                          ((anon_unknown_0 *)this_00,(Descriptor *)classname._M_len,classname_00,
                           equality_mode_00);
        iVar8 = iVar8 + 1;
      } while (!bVar4);
      return bVar3;
    }
    pSVar7 = FileDescriptor::service(file,iVar8);
    puVar2 = (ushort *)(pSVar7->all_names_).payload_;
    a_00._M_len = (ulong)*puVar2;
    a_00._M_str = (char *)((long)puVar2 + ~a_00._M_len);
    NVar5 = java::anon_unknown_0::CheckNameEquality(a_00,classname);
    iVar8 = iVar8 + 1;
  } while (NVar5 != equality_mode);
  return true;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(const FileDescriptor* file,
                                                absl::string_view classname,
                                                NameEquality equality_mode) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (CheckNameEquality(file->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (CheckNameEquality(file->service(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  return false;
}